

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void __thiscall
LZ77Compressor::DefaultEncode::operator()
          (DefaultEncode *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,Item item)

{
  pointer *ppuVar1;
  byte bVar2;
  uchar *__args;
  iterator iVar3;
  uchar uVar4;
  uint8_t b1;
  uint8_t b2;
  byte local_1a;
  uchar local_19;
  undefined4 local_18;
  undefined2 local_14;
  
  local_18 = item._0_4_;
  local_14 = item.field_1._2_2_;
  bVar2 = item.field_1._0_1_;
  if (((uint6)item & 1) == 0) {
    iVar3._M_current =
         (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = (uchar *)((long)&local_18 + 2);
      goto LAB_00109df6;
    }
    *iVar3._M_current = bVar2;
  }
  else {
    local_1a = (byte)((uint6)item >> 0x24) & 0xf0 | bVar2;
    uVar4 = item.field_1._2_1_;
    if (this->isSwitch == true) {
      local_1a = bVar2 << 4 | local_1a >> 4;
    }
    iVar3._M_current =
         (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_19 = uVar4;
    if (iVar3._M_current ==
        (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,iVar3,&local_1a);
      iVar3._M_current =
           (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar3._M_current = local_1a;
      iVar3._M_current =
           (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    if (iVar3._M_current ==
        (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_19;
LAB_00109df6:
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,iVar3,__args);
      return;
    }
    *iVar3._M_current = uVar4;
  }
  ppuVar1 = &(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
  return;
}

Assistant:

void operator()(std::vector<uint8_t>& out, Item item) {
			if (item.isRepeat) {
				uint8_t b1 = item.length | ((item.offset >> 4) & 0xF0);
				uint8_t b2 = item.offset & 0xFF;
				if (isSwitch) {
					b1 = (b1 >> 4) | (b1 << 4);
				}
				out.push_back(b1);
				out.push_back(b2);
			} else {
				out.push_back(item.value);
			}
		}